

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::translateArguments
          (TGlslangToSpvTraverser *this,TIntermAggregate *node,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *arguments,
          CoherentFlags *lvalueCoherentFlags)

{
  TOperator TVar1;
  Id id;
  CoherentFlags *this_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Decoration decoration;
  CoherentFlags CVar5;
  undefined4 extraout_var;
  long *plVar7;
  uint *puVar8;
  ulong uVar9;
  TGlslangToSpvTraverser *this_01;
  long lVar10;
  long lVar11;
  TType *pTVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  iterator iVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  Id lvalue_id;
  Id local_104;
  Builder *local_100;
  TGlslangToSpvTraverser *local_f8;
  CoherentFlags *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  Id *local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_98;
  TIntermAggregate *local_90;
  CoherentFlags local_88 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  Id local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  long lVar6;
  
  local_f0 = lvalueCoherentFlags;
  iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x33])(node);
  lVar6 = CONCAT44(extraout_var,iVar3);
  TVar1 = (node->super_TIntermOperator).op;
  bVar17 = false;
  bVar18 = false;
  uVar13 = 0;
  if (TVar1 - EOpTextureQuerySize < 0x3c || TVar1 - EOpImageQuerySize < 0x15) {
    plVar7 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar6 + 8) + 0x18))();
    plVar7 = (long *)(**(code **)(*plVar7 + 0xf0))(plVar7);
    puVar8 = (uint *)(**(code **)(*plVar7 + 0x40))(plVar7);
    uVar13 = *puVar8;
    bVar17 = (uVar13 & 0x3ff00) == 0x30400;
    if ((uVar13 >> 0x11 & 1) == 0) {
      bVar18 = false;
    }
    else {
      plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + 8) + 0x18))();
      plVar7 = (long *)(**(code **)(*plVar7 + 0xf0))(plVar7);
      iVar3 = (**(code **)(*plVar7 + 0x38))(plVar7);
      bVar18 = iVar3 == 3;
    }
  }
  if (0 < (int)((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8)) >> 3)) {
    local_100 = &this->builder;
    local_d8 = (ulong)((uVar13 >> 0x11 & 1) == 0);
    local_c0 = 4 - local_d8;
    local_d8 = local_d8 ^ 3;
    uVar14 = 0;
    local_e0 = (ulong)((uVar13 >> 0x12 & 1) != 0) + 2;
    local_a0 = &(this->builder).accessChain.indexChain;
    local_a8 = &(this->builder).accessChain.swizzle;
    local_b0 = &(this->builder).accessChain.component;
    local_e8 = (ulong)bVar18;
    local_c8 = local_e8 + 3;
    local_b8 = local_e8 + 4;
    local_d0 = local_e8 + 5;
    local_e8 = local_e8 | 6;
    lVar15 = -4;
    local_f8 = this;
    local_98 = (vector<unsigned_int,std::allocator<unsigned_int>> *)arguments;
    local_90 = node;
    do {
      spv::Builder::clearAccessChain(local_100);
      plVar7 = *(long **)(*(long *)(lVar6 + 8) + uVar14 * 8);
      (**(code **)(*plVar7 + 0x10))(plVar7,this);
      TVar1 = (node->super_TIntermOperator).op;
      switch(TVar1) {
      case EOpImageAtomicAdd:
      case EOpImageAtomicMin:
      case EOpImageAtomicMax:
      case EOpImageAtomicAnd:
      case EOpImageAtomicOr:
      case EOpImageAtomicXor:
      case EOpImageAtomicExchange:
      case EOpImageAtomicCompSwap:
      case EOpImageAtomicLoad:
      case EOpImageAtomicStore:
        uVar9 = 0;
        break;
      case EOpSubpassLoad:
      case EOpSubpassLoadMS:
      case EOpColorAttachmentReadEXT:
      case EOpImageGuardEnd:
      case EOpTextureGuardBegin:
      case EOpTextureQuerySize:
      case EOpTextureQueryLod:
      case EOpTextureQueryLevels:
      case EOpTextureQuerySamples:
      case EOpSamplingGuardBegin:
      case EOpTexture:
      case EOpTextureProj:
      case EOpTextureLod:
      case EOpTextureOffset:
      case EOpTextureFetch:
      case EOpTextureFetchOffset:
      case EOpTextureProjOffset:
      case EOpTextureLodOffset:
      case EOpTextureProjLod:
      case EOpTextureProjLodOffset:
      case EOpTextureGrad:
      case EOpTextureGradOffset:
      case EOpTextureProjGrad:
      case EOpTextureProjGradOffset:
      case EOpTextureGather:
      case EOpTextureGatherOffset:
      case EOpTextureGatherOffsets:
      case EOpTextureClamp:
      case EOpTextureOffsetClamp:
      case EOpTextureGradClamp:
      case EOpTextureGradOffsetClamp:
      case EOpTextureGatherLod:
      case EOpTextureGatherLodOffset:
      case EOpTextureGatherLodOffsets:
      case EOpFragmentMaskFetch:
      case EOpFragmentFetch:
      case EOpSparseTextureGuardBegin:
      case EOpSparseTexelsResident:
      case EOpSparseTextureGuardEnd:
      case EOpImageFootprintGuardBegin:
        goto switchD_0044b6c8_caseD_200;
      case EOpSparseImageLoad:
        uVar9 = local_e0;
        break;
      case EOpSparseImageLoadLod:
      case EOpSparseTextureGatherLod:
        uVar9 = 3;
        break;
      case EOpSparseTexture:
        if (bVar17) {
          if (uVar14 != 3) {
LAB_0044b96e:
            bVar20 = uVar14 == 2;
LAB_0044b989:
            if ((bVar17 || bVar18 != false) || !bVar20) goto switchD_0044b6c8_caseD_200;
          }
        }
        else if ((bVar18 & uVar14 == 3) == 0) goto LAB_0044b96e;
        goto LAB_0044b803;
      case EOpSparseTextureLod:
      case EOpSparseTextureOffset:
        uVar9 = local_c8;
        break;
      case EOpSparseTextureFetch:
        bVar20 = uVar14 == 3;
        bVar19 = uVar14 == 2;
        goto LAB_0044b7ab;
      case EOpSparseTextureFetchOffset:
        bVar20 = uVar14 == 4;
        bVar19 = uVar14 == 3;
LAB_0044b7ab:
        bVar2 = (uVar13 >> 8 & 0xff) == 5;
        if (((bool)(!bVar2 & bVar20)) || ((bool)(bVar2 & bVar19))) goto LAB_0044b803;
        goto switchD_0044b6c8_caseD_200;
      case EOpSparseTextureLodOffset:
      case EOpSparseTextureGrad:
      case EOpSparseTextureOffsetClamp:
        uVar9 = local_b8;
        break;
      case EOpSparseTextureGradOffset:
      case EOpSparseTextureGradClamp:
        uVar9 = local_d0;
        break;
      case EOpSparseTextureGather:
        uVar9 = local_d8;
        break;
      case EOpSparseTextureGatherOffset:
      case EOpSparseTextureGatherOffsets:
        uVar9 = local_c0;
        break;
      case EOpSparseTextureClamp:
        if (bVar17) {
          if (uVar14 != 4) {
LAB_0044b985:
            bVar20 = uVar14 == 3;
            goto LAB_0044b989;
          }
        }
        else if ((bVar18 & uVar14 == 4) == 0) goto LAB_0044b985;
        goto LAB_0044b803;
      case EOpSparseTextureGradOffsetClamp:
        uVar9 = local_e8;
        break;
      case EOpSparseTextureGatherLodOffset:
      case EOpSparseTextureGatherLodOffsets:
      case EOpImageSampleFootprintNV:
        uVar9 = 4;
        break;
      case EOpImageSampleFootprintClampNV:
      case EOpImageSampleFootprintLodNV:
        uVar9 = 5;
        break;
      case EOpImageSampleFootprintGradNV:
        uVar9 = 6;
        break;
      case EOpImageSampleFootprintGradClampNV:
        uVar9 = 7;
        break;
      default:
        uVar4 = TVar1 - EOpRayQueryGetIntersectionTriangleVertexPositionsEXT;
        if ((uVar4 < 0x12) && ((0x30001U >> (uVar4 & 0x1f) & 1) != 0)) {
          uVar9 = 2;
          break;
        }
        goto switchD_0044b6c8_caseD_200;
      }
      if (uVar9 == uVar14) {
LAB_0044b803:
        local_104 = spv::Builder::accessChainGetLValue(local_100);
        iVar16._M_current = *(uint **)((long)arguments + 8);
        if (iVar16._M_current == *(uint **)((long)arguments + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)arguments,iVar16,
                     &local_104);
        }
        else {
          *iVar16._M_current = local_104;
          *(uint **)((long)arguments + 8) = iVar16._M_current + 1;
        }
        local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,local_a0);
        local_68 = (this->builder).accessChain.instr;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,local_a8);
        local_38 = *(undefined2 *)(local_b0 + 4);
        local_48 = *(undefined8 *)local_b0;
        uStack_40 = *(undefined8 *)(local_b0 + 2);
        *(undefined2 *)local_f0 = local_38;
        if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        this_00 = local_f0;
        this = local_f8;
        id = local_104;
        decoration = TranslateNonUniformDecoration(local_f8,local_f0);
        pTVar12 = (TType *)(ulong)id;
        spv::Builder::addDecoration(local_100,id,decoration,-1);
        plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar14 * 8) + 0x18))();
        this_01 = (TGlslangToSpvTraverser *)(**(code **)(*plVar7 + 0xf0))(plVar7);
        CVar5 = TranslateCoherent(this_01,pTVar12);
        local_88[0]._0_2_ = CVar5._0_2_;
        spv::Builder::AccessChain::CoherentFlags::operator|=(this_00,local_88);
        node = local_90;
        arguments = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98;
      }
      else {
switchD_0044b6c8_caseD_200:
        if (((uVar14 == 0) ||
            (lVar10 = (**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar14 * 8) + 0x60))(),
            lVar10 == 0)) ||
           (lVar10 = (**(code **)(**(long **)(*(long *)(lVar6 + 8) + -8 + uVar14 * 8) + 0x60))(),
           lVar10 == 0)) {
LAB_0044ba1d:
          plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar14 * 8) + 0x18))();
          pTVar12 = (TType *)(**(code **)(*plVar7 + 0xf0))(plVar7);
          CVar5 = (CoherentFlags)accessChainLoad(this,pTVar12);
          iVar16._M_current = *(uint **)((long)arguments + 8);
          local_88[0] = CVar5;
          if (iVar16._M_current == *(uint **)((long)arguments + 0x10)) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(arguments,iVar16,(uint *)local_88);
            goto LAB_0044ba6f;
          }
        }
        else {
          plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar14 * 8) + 0x60))();
          lVar10 = (**(code **)(*plVar7 + 0x180))(plVar7);
          plVar7 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + -8 + uVar14 * 8) + 0x60))
                                     ();
          lVar11 = (**(code **)(*plVar7 + 0x180))(plVar7);
          this = local_f8;
          if (lVar10 != lVar11) goto LAB_0044ba1d;
          iVar16._M_current = *(uint **)((long)arguments + 8);
          if (iVar16._M_current == *(uint **)((long)arguments + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)arguments,iVar16,
                       (uint *)(*(long *)arguments + lVar15));
            goto LAB_0044ba6f;
          }
          CVar5 = *(CoherentFlags *)(*(long *)arguments + -4 + uVar14 * 4);
        }
        *iVar16._M_current = (uint)CVar5;
        *(CoherentFlags **)((long)arguments + 8) = (CoherentFlags *)iVar16._M_current + 1;
      }
LAB_0044ba6f:
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 4;
    } while ((long)uVar14 <
             (long)(int)((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8)) >> 3));
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::translateArguments(const glslang::TIntermAggregate& node, std::vector<spv::Id>& arguments,
    spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags)
{
    const glslang::TIntermSequence& glslangArguments = node.getSequence();

    glslang::TSampler sampler = {};
    bool cubeCompare = false;
    bool f16ShadowCompare = false;
    if (node.isTexture() || node.isImage()) {
        sampler = glslangArguments[0]->getAsTyped()->getType().getSampler();
        cubeCompare = sampler.dim == glslang::EsdCube && sampler.arrayed && sampler.shadow;
        f16ShadowCompare = sampler.shadow &&
            glslangArguments[1]->getAsTyped()->getType().getBasicType() == glslang::EbtFloat16;
    }

    for (int i = 0; i < (int)glslangArguments.size(); ++i) {
        builder.clearAccessChain();
        glslangArguments[i]->traverse(this);

        // Special case l-value operands
        bool lvalue = false;
        switch (node.getOp()) {
        case glslang::EOpImageAtomicAdd:
        case glslang::EOpImageAtomicMin:
        case glslang::EOpImageAtomicMax:
        case glslang::EOpImageAtomicAnd:
        case glslang::EOpImageAtomicOr:
        case glslang::EOpImageAtomicXor:
        case glslang::EOpImageAtomicExchange:
        case glslang::EOpImageAtomicCompSwap:
        case glslang::EOpImageAtomicLoad:
        case glslang::EOpImageAtomicStore:
            if (i == 0)
                lvalue = true;
            break;
        case glslang::EOpSparseImageLoad:
            if ((sampler.ms && i == 3) || (! sampler.ms && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTexture:
            if (((cubeCompare || f16ShadowCompare) && i == 3) || (! (cubeCompare || f16ShadowCompare) && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureClamp:
            if (((cubeCompare || f16ShadowCompare) && i == 4) || (! (cubeCompare || f16ShadowCompare) && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureLod:
        case glslang::EOpSparseTextureOffset:
            if  ((f16ShadowCompare && i == 4) || (! f16ShadowCompare && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureFetch:
            if ((sampler.dim != glslang::EsdRect && i == 3) || (sampler.dim == glslang::EsdRect && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureFetchOffset:
            if ((sampler.dim != glslang::EsdRect && i == 4) || (sampler.dim == glslang::EsdRect && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureLodOffset:
        case glslang::EOpSparseTextureGrad:
        case glslang::EOpSparseTextureOffsetClamp:
            if ((f16ShadowCompare && i == 5) || (! f16ShadowCompare && i == 4))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGradOffset:
        case glslang::EOpSparseTextureGradClamp:
            if ((f16ShadowCompare && i == 6) || (! f16ShadowCompare && i == 5))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGradOffsetClamp:
            if ((f16ShadowCompare && i == 7) || (! f16ShadowCompare && i == 6))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGather:
            if ((sampler.shadow && i == 3) || (! sampler.shadow && i == 2))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherOffset:
        case glslang::EOpSparseTextureGatherOffsets:
            if ((sampler.shadow && i == 4) || (! sampler.shadow && i == 3))
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherLod:
            if (i == 3)
                lvalue = true;
            break;
        case glslang::EOpSparseTextureGatherLodOffset:
        case glslang::EOpSparseTextureGatherLodOffsets:
            if (i == 4)
                lvalue = true;
            break;
        case glslang::EOpSparseImageLoadLod:
            if (i == 3)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintNV:
            if (i == 4)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintClampNV:
        case glslang::EOpImageSampleFootprintLodNV:
            if (i == 5)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintGradNV:
            if (i == 6)
                lvalue = true;
            break;
        case glslang::EOpImageSampleFootprintGradClampNV:
            if (i == 7)
                lvalue = true;
            break;
        case glslang::EOpRayQueryGetIntersectionTriangleVertexPositionsEXT:
        case glslang::EOpRayQueryGetIntersectionLSSPositionsNV:
        case glslang::EOpRayQueryGetIntersectionLSSRadiiNV:
            if (i == 2)
                lvalue = true;
            break;
        default:
            break;
        }

        if (lvalue) {
            spv::Id lvalue_id = builder.accessChainGetLValue();
            arguments.push_back(lvalue_id);
            lvalueCoherentFlags = builder.getAccessChain().coherentFlags;
            builder.addDecoration(lvalue_id, TranslateNonUniformDecoration(lvalueCoherentFlags));
            lvalueCoherentFlags |= TranslateCoherent(glslangArguments[i]->getAsTyped()->getType());
        } else {
            if (i > 0 &&
                glslangArguments[i]->getAsSymbolNode() && glslangArguments[i-1]->getAsSymbolNode() &&
                glslangArguments[i]->getAsSymbolNode()->getId() == glslangArguments[i-1]->getAsSymbolNode()->getId()) {
                // Reuse the id if possible
                arguments.push_back(arguments[i-1]);
            } else {
                arguments.push_back(accessChainLoad(glslangArguments[i]->getAsTyped()->getType()));
            }
        }
    }
}